

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  int iVar1;
  Rep *pRVar2;
  void **ppvVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  RepeatedPtrFieldBase local_48;
  
  local_48.arena_ = other->arena_;
  local_48.current_size_ = 0;
  local_48.total_size_ = 0;
  local_48.rep_ = (Rep *)0x0;
  iVar4 = this->current_size_;
  if (iVar4 != 0) {
    pRVar2 = this->rep_;
    ppvVar3 = InternalExtend(&local_48,iVar4);
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
              (&local_48,ppvVar3,pRVar2->elements,iVar4,
               (local_48.rep_)->allocated_size - local_48.current_size_);
    iVar4 = iVar4 + local_48.current_size_;
    local_48.current_size_ = iVar4;
    if ((local_48.rep_)->allocated_size < iVar4) {
      (local_48.rep_)->allocated_size = iVar4;
    }
    iVar4 = this->current_size_;
    if (0 < (long)iVar4) {
      pRVar2 = this->rep_;
      lVar5 = 0;
      do {
        ppvVar3 = pRVar2->elements + lVar5;
        lVar5 = lVar5 + 1;
        (**(code **)(**ppvVar3 + 0x38))();
      } while (iVar4 != lVar5);
      this->current_size_ = 0;
    }
  }
  iVar4 = other->current_size_;
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    pRVar2 = other->rep_;
    ppvVar3 = InternalExtend(this,iVar4);
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
              (this,ppvVar3,pRVar2->elements,iVar4,this->rep_->allocated_size - this->current_size_)
    ;
    iVar4 = iVar4 + this->current_size_;
    this->current_size_ = iVar4;
    if (this->rep_->allocated_size < iVar4) {
      this->rep_->allocated_size = iVar4;
    }
    iVar4 = other->current_size_;
    lVar5 = (long)iVar4;
    if (0 < lVar5) {
      pRVar2 = other->rep_;
      iVar4 = 0;
      lVar6 = 0;
      do {
        ppvVar3 = pRVar2->elements + lVar6;
        lVar6 = lVar6 + 1;
        (**(code **)(**ppvVar3 + 0x38))();
      } while (lVar5 != lVar6);
    }
  }
  pRVar2 = other->rep_;
  other->rep_ = local_48.rep_;
  iVar1 = other->total_size_;
  other->current_size_ = local_48.current_size_;
  other->total_size_ = local_48.total_size_;
  local_48.total_size_ = iVar1;
  local_48.current_size_ = iVar4;
  local_48.rep_ = pRVar2;
  Destroy<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(&local_48);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(other->GetArenaNoVirtual() != GetArenaNoVirtual());

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied cross-arena only
  // once, not twice.
  RepeatedPtrFieldBase temp(other->GetArenaNoVirtual());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->Clear<TypeHandler>();
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}